

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadTorus.h
# Opt level: O2

void __thiscall
pzgeom::TPZQuadTorus::TPZQuadTorus(TPZQuadTorus *this,TPZQuadTorus *cp,TPZGeoMesh *param_2)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  REAL RVar4;
  
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_016d2788;
  iVar1 = (cp->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1];
  iVar2 = (cp->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[2];
  iVar3 = (cp->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[3];
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0] =
       (cp->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0];
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1] = iVar1
  ;
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[2] = iVar2
  ;
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[3] = iVar3
  ;
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZQuadTorus_016d2690;
  RVar4 = cp->fr;
  this->fR = cp->fR;
  this->fr = RVar4;
  TPZManVector<double,_10>::TPZManVector(&this->fOrigin,&cp->fOrigin);
  TPZFNMatrix<12,_double>::TPZFNMatrix(&this->fPhiTheta,&cp->fPhiTheta);
  return;
}

Assistant:

TPZQuadTorus(const TPZQuadTorus &cp, TPZGeoMesh &) : TPZGeoQuad(cp), fR(cp.fR), fr(cp.fr), fOrigin(cp.fOrigin), fPhiTheta(cp.fPhiTheta)
		{
		}